

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.cpp
# Opt level: O0

void __thiscall chatter::Peer::reset(Peer *this)

{
  int local_1c;
  uint32_t local_18;
  int i;
  Peer *local_10;
  Peer *this_local;
  
  this->m_state = DISCONNECTED;
  local_10 = this;
  HostAddress::HostAddress((HostAddress *)&stack0xffffffffffffffe8);
  (this->m_address).m_address = local_18;
  (this->m_address).m_port = (uint16_t)i;
  this->m_is_incoming_connection = false;
  this->m_connect_ts = 0;
  this->m_last_recv_ts = 0;
  this->m_last_ping_ts = 0;
  this->m_last_rtt_ts = 0;
  this->m_rtt_avg = 0;
  this->m_rtt_dev = 0;
  this->m_congestion_window = 3000;
  this->m_bytes_on_wire = 0;
  for (local_1c = 0; local_1c < 0x21; local_1c = local_1c + 1) {
    std::__cxx11::
    list<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>::
    clear(&this->m_channels[local_1c].sent_reliable);
    this->m_channels[local_1c].next_sequence = 0;
    this->m_channels[local_1c].id = (ProtocolChannelID)local_1c;
  }
  return;
}

Assistant:

void Peer::reset()
{
    m_state = PeerState::DISCONNECTED;
    m_address = HostAddress();
    m_is_incoming_connection = false;
    m_connect_ts = 0;
    m_last_recv_ts = 0;
    m_last_ping_ts = 0;
    m_last_rtt_ts = 0;
    m_rtt_avg = 0;
    m_rtt_dev = 0;
    m_congestion_window = kMinCongestionWindow;
    m_bytes_on_wire = 0;

    for (int i = 0; i < 33; ++i) {
        m_channels[i].sent_reliable.clear();
        m_channels[i].next_sequence = 0;
        m_channels[i].id = i;
    }
}